

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::SerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,uint8 *target)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    target = Extension::SerializeMessageSetItemWithCachedSizesToArray
                       ((Extension *)&p_Var1[1]._M_parent,p_Var1[1]._M_color,target);
  }
  return target;
}

Assistant:

uint8* ExtensionSet::SerializeMessageSetWithCachedSizesToArray(
    uint8* target) const {
  map<int, Extension>::const_iterator iter;
  for (iter = extensions_.begin(); iter != extensions_.end(); ++iter) {
    target = iter->second.SerializeMessageSetItemWithCachedSizesToArray(
        iter->first, target);
  }
  return target;
}